

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM_Command.h
# Opt level: O0

shared_ptr<nigel::IM_Constant> __thiscall
nigel::IM_Constant::fromAstLiteral(IM_Constant *this,shared_ptr<nigel::AstLiteral> *ast)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nigel::IM_Constant> sVar2;
  undefined1 local_28 [24];
  shared_ptr<nigel::AstLiteral> *ast_local;
  
  local_28._16_8_ = ast;
  ast_local = (shared_ptr<nigel::AstLiteral> *)this;
  peVar1 = std::__shared_ptr_access<nigel::AstLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nigel::AstLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ast);
  std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &peVar1->token);
  Token::as<nigel::Token_NumberL>((Token *)local_28);
  std::__shared_ptr_access<const_nigel::Token_NumberL,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<const_nigel::Token_NumberL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_28);
  std::make_shared<nigel::IM_Constant,int_const&>((int *)this);
  std::shared_ptr<const_nigel::Token_NumberL>::~shared_ptr
            ((shared_ptr<const_nigel::Token_NumberL> *)local_28);
  sVar2.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<nigel::IM_Constant>)
         sVar2.super___shared_ptr<nigel::IM_Constant,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<IM_Constant> fromAstLiteral( std::shared_ptr<AstLiteral> ast )
		{
			return std::make_shared<IM_Constant>( ast->token->as<Token_NumberL>()->number );
		}